

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O0

URL * __thiscall URL::GetPortNumber_abi_cxx11_(URL *this)

{
  long in_RSI;
  URL *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x60));
  return this;
}

Assistant:

std::string URL::GetPortNumber() {
  return _portNumber;
}